

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O2

void __thiscall OpenMD::ifstrstream::~ifstrstream(ifstrstream *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var1[-3]) = vtt[3];
  close(this,(int)vtt);
  std::filebuf::~filebuf
            ((filebuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  std::__cxx11::stringbuf::~stringbuf
            ((stringbuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10);
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var1[-3]) = vtt[2];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._M_gcount = 0;
  return;
}

Assistant:

ifstrstream::~ifstrstream() { close(); }